

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FileDescriptor * __thiscall
google::protobuf::DescriptorBuilder::BuildFile(DescriptorBuilder *this,FileDescriptorProto *proto)

{
  pointer pbVar1;
  DescriptorPool *this_00;
  RepeatedPtrFieldBase *pRVar2;
  __type _Var3;
  FileDescriptor *pFVar4;
  Type *pTVar5;
  Tables *pTVar6;
  int i;
  int index;
  long lVar7;
  DescriptorPool *this_01;
  ulong uVar8;
  RepeatedPtrFieldBase *this_02;
  undefined1 local_150 [8];
  FileDescriptorProto existing_proto;
  string local_58;
  RepeatedPtrFieldBase *local_38;
  
  std::__cxx11::string::_M_assign((string *)&this->filename_);
  pFVar4 = DescriptorPool::Tables::FindFile(this->tables_,&this->filename_);
  if (pFVar4 != (FileDescriptor *)0x0) {
    FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_150);
    FileDescriptor::CopyTo(pFVar4,(FileDescriptorProto *)local_150);
    if ((*(int *)(pFVar4 + 0x3c) == 2) && (((proto->_has_bits_).has_bits_[0] & 4) != 0)) {
      FileDescriptorProto::set_syntax((FileDescriptorProto *)local_150,"proto2");
    }
    MessageLite::SerializeAsString_abi_cxx11_(&local_58,(MessageLite *)local_150);
    MessageLite::SerializeAsString_abi_cxx11_
              ((string *)&existing_proto.source_code_info_,(MessageLite *)proto);
    _Var3 = std::operator==(&local_58,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &existing_proto.source_code_info_);
    std::__cxx11::string::~string((string *)&existing_proto.source_code_info_);
    std::__cxx11::string::~string((string *)&local_58);
    FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_150);
    if (_Var3) {
      return pFVar4;
    }
  }
  lVar7 = 0;
  uVar8 = 0;
  while( true ) {
    pTVar6 = this->tables_;
    pbVar1 = (pTVar6->pending_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pTVar6->pending_files_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar8)
    break;
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(pbVar1->_M_dataplus)._M_p + lVar7),(proto->name_).ptr_);
    if (_Var3) {
      AddRecursiveImportError(this,proto,(int)uVar8);
      goto LAB_002ada4b;
    }
    uVar8 = uVar8 + 1;
    lVar7 = lVar7 + 0x20;
  }
  if ((this->pool_->lazily_build_dependencies_ == false) &&
     (this->pool_->fallback_database_ != (DescriptorDatabase *)0x0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pTVar6->pending_files_,(proto->name_).ptr_);
    this_02 = &(proto->dependency_).super_RepeatedPtrFieldBase;
    local_38 = this_02;
    for (index = 0; pTVar6 = this->tables_,
        index < (proto->dependency_).super_RepeatedPtrFieldBase.current_size_; index = index + 1) {
      pTVar5 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (this_02,index);
      pFVar4 = DescriptorPool::Tables::FindFile(pTVar6,pTVar5);
      pRVar2 = local_38;
      if (pFVar4 == (FileDescriptor *)0x0) {
        this_01 = this->pool_;
        this_00 = this_01->underlay_;
        if (this_00 != (DescriptorPool *)0x0) {
          pTVar5 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (local_38,index);
          pFVar4 = DescriptorPool::FindFileByName(this_00,pTVar5);
          this_02 = pRVar2;
          if (pFVar4 != (FileDescriptor *)0x0) goto LAB_002ad9f4;
          this_01 = this->pool_;
        }
        this_02 = local_38;
        pTVar5 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (local_38,index);
        DescriptorPool::TryFindFileInFallbackDatabase(this_01,pTVar5);
      }
LAB_002ad9f4:
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back(&pTVar6->pending_files_);
    pTVar6 = this->tables_;
  }
  DescriptorPool::Tables::AddCheckpoint(pTVar6);
  pFVar4 = BuildFileImpl(this,proto);
  FileDescriptorTables::FinalizeTables(this->file_tables_);
  if (pFVar4 == (FileDescriptor *)0x0) {
    DescriptorPool::Tables::RollbackToLastCheckpoint(this->tables_);
LAB_002ada4b:
    pFVar4 = (FileDescriptor *)0x0;
  }
  else {
    DescriptorPool::Tables::ClearLastCheckpoint(this->tables_);
    pFVar4[0x41] = (FileDescriptor)0x1;
  }
  return pFVar4;
}

Assistant:

const FileDescriptor* DescriptorBuilder::BuildFile(
    const FileDescriptorProto& proto) {
  filename_ = proto.name();

  // Check if the file already exists and is identical to the one being built.
  // Note:  This only works if the input is canonical -- that is, it
  //   fully-qualifies all type names, has no UninterpretedOptions, etc.
  //   This is fine, because this idempotency "feature" really only exists to
  //   accommodate one hack in the proto1->proto2 migration layer.
  const FileDescriptor* existing_file = tables_->FindFile(filename_);
  if (existing_file != nullptr) {
    // File already in pool.  Compare the existing one to the input.
    if (ExistingFileMatchesProto(existing_file, proto)) {
      // They're identical.  Return the existing descriptor.
      return existing_file;
    }

    // Not a match.  The error will be detected and handled later.
  }

  // Check to see if this file is already on the pending files list.
  // TODO(kenton):  Allow recursive imports?  It may not work with some
  //   (most?) programming languages.  E.g., in C++, a forward declaration
  //   of a type is not sufficient to allow it to be used even in a
  //   generated header file due to inlining.  This could perhaps be
  //   worked around using tricks involving inserting #include statements
  //   mid-file, but that's pretty ugly, and I'm pretty sure there are
  //   some languages out there that do not allow recursive dependencies
  //   at all.
  for (int i = 0; i < tables_->pending_files_.size(); i++) {
    if (tables_->pending_files_[i] == proto.name()) {
      AddRecursiveImportError(proto, i);
      return nullptr;
    }
  }

  // If we have a fallback_database_, and we aren't doing lazy import building,
  // attempt to load all dependencies now, before checkpointing tables_.  This
  // avoids confusion with recursive checkpoints.
  if (!pool_->lazily_build_dependencies_) {
    if (pool_->fallback_database_ != nullptr) {
      tables_->pending_files_.push_back(proto.name());
      for (int i = 0; i < proto.dependency_size(); i++) {
        if (tables_->FindFile(proto.dependency(i)) == nullptr &&
            (pool_->underlay_ == nullptr ||
             pool_->underlay_->FindFileByName(proto.dependency(i)) ==
                 nullptr)) {
          // We don't care what this returns since we'll find out below anyway.
          pool_->TryFindFileInFallbackDatabase(proto.dependency(i));
        }
      }
      tables_->pending_files_.pop_back();
    }
  }

  // Checkpoint the tables so that we can roll back if something goes wrong.
  tables_->AddCheckpoint();

  FileDescriptor* result = BuildFileImpl(proto);

  file_tables_->FinalizeTables();
  if (result) {
    tables_->ClearLastCheckpoint();
    result->finished_building_ = true;
  } else {
    tables_->RollbackToLastCheckpoint();
  }

  return result;
}